

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

Data QDateTimePrivate::create
               (QDate toDate,QTime toTime,QTimeZone *zone,TransitionResolution resolve)

{
  long lVar1;
  bool bVar2;
  QDate in_RCX;
  Data *in_RDI;
  QFlagsStorage<QDateTimePrivate::TransitionOption> in_R8D;
  long in_FS_OFFSET;
  Data *result;
  QDateTimeData *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  Data *d;
  TransitionResolution res;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  d = in_RDI;
  QDateTime::Data::Data(in_RDI,(QTimeZone *)in_RDI);
  setDateTime((QDateTimeData *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),in_RCX,
              (QTime)in_R8D.i);
  res = (TransitionResolution)in_RCX.jd;
  bVar2 = QTimeZone::isUtcOrFixedOffset((QTimeZone *)0x56dcb8);
  if (bVar2) {
    refreshSimpleDateTime(in_stack_ffffffffffffff90);
  }
  else {
    toTransitionOptions(res);
    refreshZonedDateTime(d,(QTimeZone *)&in_RDI->data,(TransitionOptions)in_R8D.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (Data)(QDateTimePrivate *)in_RDI;
}

Assistant:

Q_NEVER_INLINE
QDateTime::Data QDateTimePrivate::create(QDate toDate, QTime toTime, const QTimeZone &zone,
                                         QDateTime::TransitionResolution resolve)
{
    QDateTime::Data result(zone);
    setDateTime(result, toDate, toTime);
    if (zone.isUtcOrFixedOffset())
        refreshSimpleDateTime(result);
    else
        refreshZonedDateTime(result, zone, toTransitionOptions(resolve));
    return result;
}